

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddP70<double,double,double>
          (Node *this,string *name,string *type,string *type2,string *flags,double more,
          double more_1,double more_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Node n;
  double more_local_2;
  double more_local_1;
  double more_local;
  string *flags_local;
  string *type2_local;
  string *type_local;
  string *name_local;
  Node *this_local;
  
  n.property_start = (size_t)more_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"P",&local_d9);
  Node((Node *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::string((string *)&local_110,(string *)name);
  std::__cxx11::string::string((string *)&local_130,(string *)type);
  std::__cxx11::string::string((string *)&local_150,(string *)type2);
  std::__cxx11::string::string((string *)&local_170,(string *)flags);
  AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,double,double,double>
            ((Node *)local_b8,&local_110,&local_130,&local_150,&local_170,more,more_1,
             (double)n.property_start);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  AddChild(this,(Node *)local_b8);
  ~Node((Node *)local_b8);
  return;
}

Assistant:

void AddP70(
        const std::string& name,
        const std::string& type,
        const std::string& type2,
        const std::string& flags,
        More... more
    ) {
        Node n("P");
        n.AddProperties(name, type, type2, flags, more...);
        AddChild(n);
    }